

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlDtdPtr pxVar2;
  xmlDtdPtr dtd;
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (ctxt->sax->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0)) {
      (*ctxt->sax->setDocumentLocator)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    if (((ctxt->input->flags & 1U) == 0) &&
       (iVar1 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar1 == 0)) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
    }
    htmlSkipBlankChars(ctxt);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (ctxt->sax->startDocument != (startDocumentSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
      (*ctxt->sax->startDocument)(ctxt->userData);
    }
    while (*ctxt->input->cur == '<') {
      if (((ctxt->input->cur[1] == '!') && (ctxt->input->cur[2] == '-')) &&
         (ctxt->input->cur[3] == '-')) {
        ctxt->input->cur = ctxt->input->cur + 4;
        ctxt->input->col = ctxt->input->col + 4;
        htmlParseComment(ctxt,0);
      }
      else {
        if (ctxt->input->cur[1] != '?') break;
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
        htmlParseComment(ctxt,1);
      }
      htmlSkipBlankChars(ctxt);
    }
    if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
       ((((iVar1 = toupper((uint)ctxt->input->cur[2]), iVar1 == 0x44 &&
          (((iVar1 = toupper((uint)ctxt->input->cur[3]), iVar1 == 0x4f &&
            (iVar1 = toupper((uint)ctxt->input->cur[4]), iVar1 == 0x43)) &&
           (iVar1 = toupper((uint)ctxt->input->cur[5]), iVar1 == 0x54)))) &&
         ((iVar1 = toupper((uint)ctxt->input->cur[6]), iVar1 == 0x59 &&
          (iVar1 = toupper((uint)ctxt->input->cur[7]), iVar1 == 0x50)))) &&
        (iVar1 = toupper((uint)ctxt->input->cur[8]), iVar1 == 0x45)))) {
      ctxt->instate = XML_PARSER_MISC;
      htmlParseDocTypeDecl(ctxt);
    }
    htmlSkipBlankChars(ctxt);
    ctxt->instate = XML_PARSER_PROLOG;
    while (*ctxt->input->cur == '<') {
      if (((ctxt->input->cur[1] == '!') && (ctxt->input->cur[2] == '-')) &&
         (ctxt->input->cur[3] == '-')) {
        ctxt->input->cur = ctxt->input->cur + 4;
        ctxt->input->col = ctxt->input->col + 4;
        htmlParseComment(ctxt,0);
      }
      else {
        if (ctxt->input->cur[1] != '?') break;
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
        htmlParseComment(ctxt,1);
      }
      htmlSkipBlankChars(ctxt);
    }
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);
    if (*ctxt->input->cur == '\0') {
      htmlAutoCloseOnEnd(ctxt);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endDocument != (endDocumentSAXFunc)0x0))
    {
      (*ctxt->sax->endDocument)(ctxt->userData);
    }
    if ((((ctxt->options & 4U) == 0) && (ctxt->myDoc != (xmlDocPtr)0x0)) &&
       (pxVar2 = xmlGetIntSubset(ctxt->myDoc), pxVar2 == (xmlDtdPtr)0x0)) {
      pxVar2 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                  (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                  (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      ctxt->myDoc->intSubset = pxVar2;
      if (ctxt->myDoc->intSubset == (_xmlDtd *)0x0) {
        htmlErrMemory(ctxt);
      }
    }
    if (ctxt->wellFormed == 0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlDtdPtr dtd;

    if ((ctxt == NULL) || (ctxt->input == NULL))
	return(-1);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    /*
     * TODO: Implement HTML5 prescan algorithm
     */

    /*
     * This is wrong but matches long-standing behavior. In most
     * cases, a document starting with an XML declaration will
     * specify UTF-8. The HTML5 prescan algorithm handles
     * XML declarations in a better way.
     */
    if (((ctxt->input->flags & XML_INPUT_HAS_ENCODING) == 0) &&
        (xmlStrncmp(ctxt->input->cur, BAD_CAST "<?xm", 4) == 0))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_UTF8);

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);

    /*
     * Parse possible comments and PIs before any content
     */
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
        ctxt->instate = XML_PARSER_MISC;
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    ctxt->instate = XML_PARSER_PROLOG;
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL) {
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
            if (ctxt->myDoc->intSubset == NULL)
                htmlErrMemory(ctxt);
        }
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}